

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

QVariant * __thiscall
QPlainTextEdit::inputMethodQuery
          (QVariant *__return_storage_ptr__,QPlainTextEdit *this,InputMethodQuery query,
          QVariant argument)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  QPoint QVar4;
  undefined8 uVar5;
  long lVar6;
  QVariant *in_RCX;
  QVariant *pQVar7;
  anon_union_24_3_e3d07ef4_for_data *paVar8;
  long in_FS_OFFSET;
  double dVar9;
  QRect QVar13;
  QPointF QVar14;
  QPointF QVar15;
  QPoint local_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  QPointF local_88;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  undefined4 uVar10;
  double dVar11;
  undefined4 uVar12;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (query == ImReadOnly) {
    bVar2 = isReadOnly(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0045b64a:
      ::QVariant::QVariant(__return_storage_ptr__,bVar2);
      return __return_storage_ptr__;
    }
    goto LAB_0045b8cb;
  }
  if ((query == ImHints) || (query == ImInputItemClipRectangle)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidget::inputMethodQuery(__return_storage_ptr__,(QWidget *)this,query);
      return __return_storage_ptr__;
    }
    goto LAB_0045b8cb;
  }
  if (query == ImEnabled) {
    if ((((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes & 1)
        == 0) {
      bVar2 = isReadOnly(this);
      bVar2 = !bVar2;
    }
    else {
      bVar2 = false;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_0045b64a;
    goto LAB_0045b8cb;
  }
  lVar6 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QVar14 = contentOffset(this);
  uVar10 = QVar14.yp._0_4_;
  uVar12 = QVar14.yp._4_4_;
  local_88.xp = QVar14.xp;
  local_88.yp = QVar14.yp;
  iVar3 = ::QVariant::typeId(in_RCX);
  QVar13.x2.m_i = local_c8._8_4_;
  QVar13.y2.m_i = local_c8._12_4_;
  QVar13.x1.m_i = local_c8._0_4_;
  QVar13.y1.m_i = local_c8._4_4_;
  dVar11 = (double)CONCAT44(uVar12,uVar10);
  switch(iVar3) {
  case 0x13:
    local_c8 = ::QVariant::toRect();
    QVar4 = QPointF::toPoint(&local_88);
    local_d0 = (QPoint)((ulong)(uint)-QVar4.xp.m_i.m_i - ((ulong)QVar4 & 0xffffffff00000000));
    QVar13 = QRect::translated((QRect *)local_c8,&local_d0);
    ::QVariant::QVariant((QVariant *)&local_58,QVar13);
    dVar11 = (double)CONCAT44(uVar12,uVar10);
    break;
  case 0x14:
    pQVar7 = in_RCX;
    ::QVariant::toRectF();
    local_a8 = (double)local_c8._0_8_ - local_88.xp;
    dStack_a0 = (double)local_c8._8_8_ - local_88.yp;
    local_98 = local_b8;
    uVar5 = local_98;
    uStack_90 = uStack_b0;
    local_98._0_4_ = (undefined4)local_b8;
    local_98._4_4_ = (undefined4)((ulong)local_b8 >> 0x20);
    uVar10 = (undefined4)local_98;
    uVar12 = local_98._4_4_;
    local_98 = uVar5;
    ::QVariant::QVariant((QVariant *)&local_58,(QRectF *)pQVar7);
    dVar11 = (double)CONCAT44(uVar12,uVar10);
    break;
  default:
    goto switchD_0045b5d7_caseD_15;
  case 0x19:
    uVar5 = ::QVariant::toPoint();
    dVar9 = (double)(int)uVar5;
    dVar11 = (double)(int)((ulong)uVar5 >> 0x20);
    goto LAB_0045b6d8;
  case 0x1a:
    dVar9 = (double)::QVariant::toPointF();
    dVar11 = (double)CONCAT44(uVar12,uVar10);
LAB_0045b6d8:
    QVar15.xp = dVar9 - QVar14.xp;
    dVar11 = dVar11 - QVar14.yp;
    QVar15.yp = dVar11;
    ::QVariant::QVariant((QVariant *)&local_58,QVar15);
  }
  ::QVariant::operator=(in_RCX,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QVar13 = (QRect)local_c8;
switchD_0045b5d7_caseD_15:
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  plVar1 = *(long **)(lVar6 + 800);
  local_c8 = (undefined1  [16])QVar13;
  ::QVariant::QVariant(&local_78,in_RCX);
  (**(code **)(*plVar1 + 0x90))(&local_58,plVar1,query,&local_78);
  ::QVariant::~QVariant(&local_78);
  iVar3 = ::QVariant::typeId((QVariant *)&local_58);
  switch(iVar3) {
  case 0x13:
    QVar13 = (QRect)::QVariant::toRect();
    local_c8 = (undefined1  [16])QVar13;
    local_d0 = QPointF::toPoint(&local_88);
    QVar13 = QRect::translated((QRect *)local_c8,&local_d0);
    ::QVariant::QVariant(__return_storage_ptr__,QVar13);
    break;
  case 0x14:
    paVar8 = &local_58;
    ::QVariant::toRectF();
    ::QVariant::QVariant(__return_storage_ptr__,(QRectF *)paVar8->data);
    break;
  default:
    ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)&local_58);
    break;
  case 0x19:
    lVar6 = ::QVariant::toPoint();
    QVar4 = QPointF::toPoint(&local_88);
    ::QVariant::QVariant
              (__return_storage_ptr__,
               (QPoint)((ulong)(uint)((int)lVar6 + QVar4.xp.m_i.m_i) |
                       ((ulong)QVar4 & 0xffffffff00000000) + lVar6 & 0xffffffff00000000));
    break;
  case 0x1a:
    dVar9 = (double)::QVariant::toPointF();
    QVar14.xp = dVar9 + local_88.xp;
    QVar14.yp = dVar11 + local_88.yp;
    ::QVariant::QVariant(__return_storage_ptr__,QVar14);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0045b8cb:
  __stack_chk_fail();
}

Assistant:

QVariant QPlainTextEdit::inputMethodQuery(Qt::InputMethodQuery query, QVariant argument) const
{
    Q_D(const QPlainTextEdit);
    switch (query) {
    case Qt::ImEnabled:
        return isEnabled() && !isReadOnly();
    case Qt::ImHints:
    case Qt::ImInputItemClipRectangle:
        return QWidget::inputMethodQuery(query);
    case Qt::ImReadOnly:
        return isReadOnly();
    default:
        break;
    }

    const QPointF offset = contentOffset();
    switch (argument.userType()) {
    case QMetaType::QRectF:
        argument = argument.toRectF().translated(-offset);
        break;
    case QMetaType::QPointF:
        argument = argument.toPointF() - offset;
        break;
    case QMetaType::QRect:
        argument = argument.toRect().translated(-offset.toPoint());
        break;
    case QMetaType::QPoint:
        argument = argument.toPoint() - offset;
        break;
    default:
        break;
    }

    const QVariant v = d->control->inputMethodQuery(query, argument);
    switch (v.userType()) {
    case QMetaType::QRectF:
        return v.toRectF().translated(offset);
    case QMetaType::QPointF:
        return v.toPointF() + offset;
    case QMetaType::QRect:
        return v.toRect().translated(offset.toPoint());
    case QMetaType::QPoint:
        return v.toPoint() + offset.toPoint();
    default:
        break;
    }
    return v;
}